

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 p_min;
  ImVec2 p_min_00;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 IVar1;
  ImVec2 IVar2;
  bool bVar3;
  float scale;
  ImVec2 *in_RCX;
  char *in_RDX;
  uint in_ESI;
  ImGuiID in_EDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImU32 bg_col_1;
  char log_suffix [3];
  char log_prefix [4];
  ImU32 bg_col;
  ImGuiNavHighlightFlags nav_highlight_flags;
  ImU32 text_col;
  bool toggled;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  bool selected;
  bool is_mouse_x_over_arrow;
  float arrow_hit_x2;
  float arrow_hit_x1;
  ImGuiButtonFlags button_flags;
  bool item_add;
  bool is_open;
  bool is_leaf;
  ImRect interact_bb;
  ImVec2 text_pos;
  float text_width;
  float text_offset_y;
  float text_offset_x;
  ImRect frame_bb;
  float frame_height;
  ImVec2 label_size;
  ImVec2 padding;
  bool display_frame;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImDrawList *in_stack_fffffffffffffe68;
  ImVec2 in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe80;
  ImGuiCol in_stack_fffffffffffffe84;
  ImGuiCol idx;
  ImRect *in_stack_fffffffffffffe88;
  ImVec2 *in_stack_fffffffffffffe90;
  ImRect *in_stack_fffffffffffffe98;
  ImVec2 *pIVar8;
  ImVec2 *in_stack_fffffffffffffea0;
  ImVec2 *text_size_if_known;
  char *in_stack_fffffffffffffea8;
  bool *in_stack_fffffffffffffeb0;
  ImDrawList *in_stack_fffffffffffffeb8;
  ImVec2 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffecc;
  byte in_stack_fffffffffffffece;
  undefined1 uVar9;
  float fill_col;
  float fVar10;
  float in_stack_fffffffffffffee4;
  ImVec2 local_110;
  ImVec2 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  ImU32 local_ec;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  ImVec2 in_stack_ffffffffffffff20;
  ImVec2 local_d0;
  ImVec2 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  ImU32 local_b0;
  undefined4 local_ac;
  ImU32 local_a8;
  bool local_a3;
  undefined1 local_a2;
  byte local_a1;
  byte local_a0;
  byte local_9f;
  byte local_9e;
  byte local_9d;
  float local_9c;
  float local_98;
  uint uVar11;
  byte bVar14;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar12;
  uint uVar13;
  uint dir;
  float col;
  float fVar15;
  float fVar16;
  float in_stack_ffffffffffffff84;
  ImVec2 local_74;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float fStack_5c;
  ImVec2 local_58;
  float local_50;
  ImVec2 local_4c;
  ImVec2 local_44;
  byte local_39;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  ImVec2 *local_20;
  char *local_18;
  uint local_c;
  ImGuiID local_8;
  bool local_1;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_39 = (local_c & 2) != 0;
    if (((bool)local_39) || ((local_c & 0x400) != 0)) {
      local_44 = (GImGui->Style).FramePadding;
    }
    else {
      in_stack_fffffffffffffee4 = (GImGui->Style).FramePadding.x;
      fVar4 = ImMin<float>((local_28->DC).CurrLineTextBaseOffset,(GImGui->Style).FramePadding.y);
      ImVec2::ImVec2(&local_44,in_stack_fffffffffffffee4,fVar4);
    }
    if (local_20 == (ImVec2 *)0x0) {
      local_20 = (ImVec2 *)FindRenderedTextEnd(local_18,(char *)0x0);
    }
    local_4c = CalcTextSize((char *)in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,
                            SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe88,0));
    fVar4 = (local_38->FramePadding).y;
    fVar4 = ImMin<float>((local_28->DC).CurrLineSize.y,fVar4 + fVar4 + local_30->FontSize);
    local_50 = ImMax<float>(fVar4,local_44.y + local_44.y + local_4c.y);
    ImRect::ImRect((ImRect *)in_stack_fffffffffffffe70);
    if ((local_c & 0x1000) == 0) {
      fVar4 = (local_28->DC).CursorPos.x;
    }
    else {
      fVar4 = (local_28->WorkRect).Min.x;
    }
    fStack_5c = (local_28->DC).CursorPos.y;
    local_58.x = (local_28->WorkRect).Max.x;
    local_58.y = (local_28->DC).CursorPos.y + local_50;
    local_60 = fVar4;
    if ((local_39 & 1) != 0) {
      local_60 = fVar4 - (float)(int)((local_28->WindowPadding).x * 0.5 + -1.0);
      local_58.x = (float)(int)((local_28->WindowPadding).x * 0.5) + local_58.x;
    }
    fVar10 = local_30->FontSize;
    if ((local_39 & 1) == 0) {
      fVar5 = local_44.x * 2.0;
    }
    else {
      fVar5 = local_44.x * 3.0;
    }
    local_64 = fVar10 + fVar5;
    local_68 = ImMax<float>(local_44.y,(local_28->DC).CurrLineTextBaseOffset);
    fill_col = local_30->FontSize;
    if (local_4c.x <= 0.0) {
      fVar6 = 0.0;
    }
    else {
      fVar6 = local_44.x + local_44.x + local_4c.x;
    }
    local_6c = fill_col + fVar6;
    ImVec2::ImVec2(&local_74,(local_28->DC).CursorPos.x + local_64,
                   (local_28->DC).CursorPos.y + local_68);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff84,local_6c,local_50);
    ItemSize(in_stack_fffffffffffffe90,(float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    fVar7 = local_58.x;
    if (((local_39 & 1) == 0) && ((local_c & 0x1800) == 0)) {
      fVar7 = (local_38->ItemSpacing).x;
      fVar7 = fVar7 + fVar7 + local_60 + local_6c;
    }
    uVar12 = CONCAT13((local_c & 0x100) != 0,(int3)in_stack_ffffffffffffff70);
    col = local_60;
    fVar15 = fStack_5c;
    fVar16 = local_58.y;
    bVar3 = TreeNodeBehaviorIsOpen
                      ((ImGuiID)in_stack_fffffffffffffe90,
                       (ImGuiTreeNodeFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    uVar13 = CONCAT13((char)((uint)uVar12 >> 0x18),CONCAT12(bVar3,(short)uVar12));
    if ((((bVar3) && ((local_30->NavIdIsAlive & 1U) == 0)) && ((local_c & 0x2000) != 0)) &&
       ((local_c & 8) == 0)) {
      (local_28->DC).TreeJumpToParentOnPopMask =
           1 << ((byte)(local_28->DC).TreeDepth & 0x1f) | (local_28->DC).TreeJumpToParentOnPopMask;
    }
    bVar3 = ItemAdd(in_stack_fffffffffffffe98,(ImGuiID)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                    in_stack_fffffffffffffe88);
    dir = CONCAT22((short)(uVar13 >> 0x10),CONCAT11(bVar3,(char)uVar13));
    (local_28->DC).LastItemStatusFlags = (local_28->DC).LastItemStatusFlags | 2;
    IVar1.y = fStack_5c;
    IVar1.x = local_60;
    (local_28->DC).LastItemDisplayRect.Min = IVar1;
    IVar2.y = local_58.y;
    IVar2.x = local_58.x;
    (local_28->DC).LastItemDisplayRect.Max = IVar2;
    if (bVar3) {
      uVar11 = 0;
      if ((local_c & 4) != 0) {
        uVar11 = 0x100;
      }
      if ((uVar13 & 0x1000000) == 0) {
        uVar11 = uVar11 | 0x40;
      }
      local_98 = (local_74.x - local_64) - (local_38->TouchExtraPadding).x;
      local_9c = (local_74.x - local_64) + local_44.x + local_44.x + local_30->FontSize +
                 (local_38->TouchExtraPadding).x;
      uVar9 = false;
      if (local_98 <= (local_30->IO).MousePos.x) {
        uVar9 = (local_30->IO).MousePos.x < local_9c;
      }
      if ((local_28 != local_30->HoveredWindow) || ((bool)uVar9 == false)) {
        uVar11 = uVar11 | 0x1000;
      }
      if (((bool)uVar9 == false) || ((local_c & 0x80) == 0)) {
        if ((local_c & 0x40) == 0) {
          scale = (float)(uVar11 | 4);
        }
        else {
          scale = (float)(uVar11 | 0x24);
        }
      }
      else {
        scale = (float)(uVar11 | 2);
      }
      local_9f = (local_c & 1) != 0;
      local_9e = local_9f;
      local_9d = uVar9;
      local_a2 = ButtonBehavior((ImRect *)
                                CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffece,
                                                        CONCAT24(in_stack_fffffffffffffecc,
                                                                 in_stack_fffffffffffffec8))),
                                (ImGuiID)in_stack_fffffffffffffec0.y,
                                (bool *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      local_a3 = false;
      if ((dir & 0x1000000) == 0) {
        if (((bool)local_a2) && (local_30->DragDropHoldJustPressedId != local_8)) {
          if (((local_c & 0xc0) == 0) || (local_30->NavActivateId == local_8)) {
            local_a3 = true;
          }
          if ((local_c & 0x80) != 0) {
            in_stack_fffffffffffffece = 0;
            if ((local_9d & 1) != 0) {
              in_stack_fffffffffffffece = local_30->NavDisableMouseHover ^ 0xff;
            }
            local_a3 = local_a3 != false || (in_stack_fffffffffffffece & 1) != 0;
          }
          if (((local_c & 0x40) != 0) && (((local_30->IO).MouseDoubleClicked[0] & 1U) != 0)) {
            local_a3 = true;
          }
        }
        else if (((bool)local_a2) && (local_30->DragDropHoldJustPressedId == local_8)) {
          if (((uint)scale & 0x40) == 0) {
            __assert_fail("button_flags & ImGuiButtonFlags_PressedOnDragDropHold",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                          ,0x154a,
                          "bool ImGui::TreeNodeBehavior(ImGuiID, ImGuiTreeNodeFlags, const char *, const char *)"
                         );
          }
          local_a3 = (dir & 0x10000) == 0;
        }
        if ((((local_30->NavId == local_8) && ((local_30->NavMoveRequest & 1U) != 0)) &&
            (local_30->NavMoveDir == 0)) && ((dir & 0x10000) != 0)) {
          local_a3 = true;
          NavMoveRequestCancel();
        }
        if (((local_30->NavId == local_8) && ((local_30->NavMoveRequest & 1U) != 0)) &&
           ((local_30->NavMoveDir == 1 && ((dir & 0x10000) == 0)))) {
          local_a3 = true;
          NavMoveRequestCancel();
        }
        if ((local_a3 & 1U) != 0) {
          dir = (dir ^ 0xff0000) & 0xff01ffff;
          ImGuiStorage::SetInt
                    ((ImGuiStorage *)in_stack_fffffffffffffea0,
                     (ImGuiID)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     (int)in_stack_fffffffffffffe98);
          (local_28->DC).LastItemStatusFlags = (local_28->DC).LastItemStatusFlags | 0x10;
        }
      }
      if ((local_c & 4) != 0) {
        SetItemAllowOverlap();
      }
      if ((local_9e & 1) != (local_9f & 1)) {
        (local_28->DC).LastItemStatusFlags = (local_28->DC).LastItemStatusFlags | 8;
      }
      local_a8 = GetColorU32(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
      local_ac = 2;
      if ((local_39 & 1) == 0) {
        if (((local_a0 & 1) != 0) || ((local_9e & 1) != 0)) {
          if (((local_a1 & 1) == 0) || ((local_a0 & 1) == 0)) {
            idx = 0x18;
            if ((local_a0 & 1) != 0) {
              idx = 0x19;
            }
          }
          else {
            idx = 0x1a;
          }
          local_ec = GetColorU32(idx,in_stack_fffffffffffffe80);
          local_f8 = CONCAT44(fStack_5c,local_60);
          local_100 = CONCAT44(local_58.y,local_58.x);
          p_min_00.y = in_stack_fffffffffffffee4;
          p_min_00.x = fVar4;
          p_max_00.y = fVar10;
          p_max_00.x = fVar5;
          RenderFrame(p_min_00,p_max_00,(ImU32)fill_col,SUB41((uint)fVar6 >> 0x18,0),
                      (float)CONCAT13(uVar9,CONCAT12(in_stack_fffffffffffffece,
                                                     in_stack_fffffffffffffecc)));
          RenderNavHighlight((ImRect *)in_stack_ffffffffffffff20,(ImGuiID)in_stack_ffffffffffffff1c,
                             (ImGuiNavHighlightFlags)in_stack_ffffffffffffff18);
        }
        uVar9 = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
        if ((local_c & 0x200) == 0) {
          if ((dir & 0x1000000) == 0) {
            in_stack_fffffffffffffe70 = (ImVec2)local_28->DrawList;
            ImVec2::ImVec2(&local_110,(local_74.x - local_64) + local_44.x,
                           local_30->FontSize * 0.15 + local_74.y);
            pos_00.y = in_stack_ffffffffffffff84;
            pos_00.x = fVar16;
            RenderArrow((ImDrawList *)CONCAT44(fVar7,fVar15),pos_00,(ImU32)col,dir,scale);
          }
          fVar4 = in_stack_fffffffffffffe70.y;
        }
        else {
          ImVec2::ImVec2(&local_108,local_74.x - local_64 * 0.5,
                         local_30->FontSize * 0.5 + local_74.y);
          RenderBullet(in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,0);
          fVar4 = in_stack_fffffffffffffe70.y;
        }
        if ((local_30->LogEnabled & 1U) != 0) {
          LogRenderedText((ImVec2 *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                          in_stack_fffffffffffffeb0);
        }
        RenderText(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb0,(bool)uVar9);
      }
      else {
        local_b0 = GetColorU32(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
        local_b8 = CONCAT44(fStack_5c,local_60);
        local_c0 = CONCAT44(local_58.y,local_58.x);
        p_min.y = in_stack_fffffffffffffee4;
        p_min.x = fVar4;
        p_max.y = fVar10;
        p_max.x = fVar5;
        RenderFrame(p_min,p_max,(ImU32)fill_col,SUB41((uint)fVar6 >> 0x18,0),
                    (float)CONCAT13(uVar9,CONCAT12(in_stack_fffffffffffffece,
                                                   in_stack_fffffffffffffecc)));
        RenderNavHighlight((ImRect *)in_stack_ffffffffffffff20,(ImGuiID)in_stack_ffffffffffffff1c,
                           (ImGuiNavHighlightFlags)in_stack_ffffffffffffff18);
        if ((local_c & 0x200) == 0) {
          if ((dir & 0x1000000) == 0) {
            in_stack_fffffffffffffeb8 = local_28->DrawList;
            ImVec2::ImVec2(&local_d0,(local_74.x - local_64) + local_44.x,local_74.y);
            pos.y = in_stack_ffffffffffffff84;
            pos.x = fVar16;
            RenderArrow((ImDrawList *)CONCAT44(fVar7,fVar15),pos,(ImU32)col,dir,scale);
          }
          else {
            local_74.x = local_74.x - local_64;
          }
          fVar4 = in_stack_fffffffffffffe70.y;
        }
        else {
          in_stack_fffffffffffffec0 = (ImVec2)local_28->DrawList;
          ImVec2::ImVec2(&local_c8,local_74.x + local_64 * -0.6,
                         local_30->FontSize * 0.5 + local_74.y);
          RenderBullet(in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,0);
          fVar4 = in_stack_fffffffffffffe70.y;
        }
        if ((local_c & 0x100000) != 0) {
          local_58.x = local_58.x - (local_30->FontSize + (local_38->FramePadding).x);
        }
        if ((local_30->LogEnabled & 1U) == 0) {
          pIVar8 = local_20;
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff18,0.0,0.0);
          RenderTextClipped((ImVec2 *)in_stack_fffffffffffffec0,(ImVec2 *)in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea0,pIVar8,(ImRect *)CONCAT44(fill_col,fVar6));
        }
        else {
          LogRenderedText((ImVec2 *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                          in_stack_fffffffffffffeb0);
          text_size_if_known = &local_58;
          pIVar8 = local_20;
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff20,0.0,0.0);
          RenderTextClipped((ImVec2 *)in_stack_fffffffffffffec0,(ImVec2 *)in_stack_fffffffffffffeb8,
                            (char *)pIVar8,local_18,text_size_if_known,
                            &in_stack_fffffffffffffe98->Min,(ImRect *)CONCAT44(fill_col,fVar6));
          LogRenderedText((ImVec2 *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                          (char *)pIVar8);
        }
      }
      bVar14 = (byte)(dir >> 0x10);
      if (((dir & 0x10000) != 0) && ((local_c & 8) == 0)) {
        TreePushOverrideID((ImGuiID)fVar4);
      }
      local_1 = (bool)(bVar14 & 1);
    }
    else {
      if (((uVar13 & 0x10000) != 0) && ((local_c & 8) == 0)) {
        TreePushOverrideID((ImGuiID)in_stack_fffffffffffffe70.y);
      }
      local_1 = (bool)((byte)(dir >> 0x10) & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = (display_frame || (flags & ImGuiTreeNodeFlags_FramePadding)) ? style.FramePadding : ImVec2(style.FramePadding.x, ImMin(window->DC.CurrLineTextBaseOffset, style.FramePadding.y));

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float frame_height = ImMax(ImMin(window->DC.CurrLineSize.y, g.FontSize + style.FramePadding.y*2), label_size.y + padding.y*2);
    ImRect frame_bb;
    frame_bb.Min.x = (flags & ImGuiTreeNodeFlags_SpanFullWidth) ? window->WorkRect.Min.x : window->DC.CursorPos.x;
    frame_bb.Min.y = window->DC.CursorPos.y;
    frame_bb.Max.x = window->WorkRect.Max.x;
    frame_bb.Max.y = window->DC.CursorPos.y + frame_height;
    if (display_frame)
    {
        // Framed header expand a little outside the default padding, to the edge of InnerClipRect
        // (FIXME: May remove this at some point and make InnerClipRect align with WindowPadding.x instead of WindowPadding.x*0.5f)
        frame_bb.Min.x -= IM_FLOOR(window->WindowPadding.x * 0.5f - 1.0f);
        frame_bb.Max.x += IM_FLOOR(window->WindowPadding.x * 0.5f);
    }

    const float text_offset_x = g.FontSize + (display_frame ? padding.x*3 : padding.x*2);               // Collapser arrow width + Spacing
    const float text_offset_y = ImMax(padding.y, window->DC.CurrLineTextBaseOffset);                    // Latch before ItemSize changes it
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x*2 : 0.0f);    // Include collapser
    ImVec2 text_pos(window->DC.CursorPos.x + text_offset_x, window->DC.CursorPos.y + text_offset_y);
    ItemSize(ImVec2(text_width, frame_height), padding.y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    ImRect interact_bb = frame_bb;
    if (!display_frame && (flags & (ImGuiTreeNodeFlags_SpanAvailWidth | ImGuiTreeNodeFlags_SpanFullWidth)) == 0)
        interact_bb.Max.x = frame_bb.Min.x + text_width + style.ItemSpacing.x * 2.0f;

    // Store a flag for the current depth to tell if we will allow closing this node when navigating one of its child.
    // For this purpose we essentially compare if g.NavIdIsAlive went from 0 to 1 between TreeNode() and TreePop().
    // This is currently only support 32 level deep and we are fine with (1 << Depth) overflowing into a zero.
    const bool is_leaf = (flags & ImGuiTreeNodeFlags_Leaf) != 0;
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    if (is_open && !g.NavIdIsAlive && (flags & ImGuiTreeNodeFlags_NavLeftJumpsBackHere) && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        window->DC.TreeJumpToParentOnPopMask |= (1 << window->DC.TreeDepth);

    bool item_add = ItemAdd(interact_bb, id);
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDisplayRect;
    window->DC.LastItemDisplayRect = frame_bb;

    if (!item_add)
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushOverrideID(id);
        IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
        return is_open;
    }

    ImGuiButtonFlags button_flags = ImGuiTreeNodeFlags_None;
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        button_flags |= ImGuiButtonFlags_AllowItemOverlap;
    if (!is_leaf)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;

    // We allow clicking on the arrow section with keyboard modifiers held, in order to easily
    // allow browsing a tree while preserving selection with code implementing multi-selection patterns.
    // When clicking on the rest of the tree node we always disallow keyboard modifiers.
    const float arrow_hit_x1 = (text_pos.x - text_offset_x) - style.TouchExtraPadding.x;
    const float arrow_hit_x2 = (text_pos.x - text_offset_x) + (g.FontSize + padding.x * 2.0f) + style.TouchExtraPadding.x;
    const bool is_mouse_x_over_arrow = (g.IO.MousePos.x >= arrow_hit_x1 && g.IO.MousePos.x < arrow_hit_x2);
    if (window != g.HoveredWindow || !is_mouse_x_over_arrow)
        button_flags |= ImGuiButtonFlags_NoKeyModifiers;

    // Open behaviors can be altered with the _OpenOnArrow and _OnOnDoubleClick flags.
    // Some alteration have subtle effects (e.g. toggle on MouseUp vs MouseDown events) due to requirements for multi-selection and drag and drop support.
    // - Single-click on label = Toggle on MouseUp (default)
    // - Single-click on arrow = Toggle on MouseUp (when _OpenOnArrow=0)
    // - Single-click on arrow = Toggle on MouseDown (when _OpenOnArrow=1)
    // - Double-click on label = Toggle on MouseDoubleClick (when _OpenOnDoubleClick=1)
    // - Double-click on arrow = Toggle on MouseDoubleClick (when _OpenOnDoubleClick=1 and _OpenOnArrow=0)
    // This makes _OpenOnArrow have a subtle effect on _OpenOnDoubleClick: arrow click reacts on Down rather than Up.
    // It is rather standard that arrow click react on Down rather than Up and we'd be tempted to make it the default
    // (by removing the _OpenOnArrow test below), however this would have a perhaps surprising effect on CollapsingHeader()?
    // So right now we are making this optional. May evolve later.
    // We set ImGuiButtonFlags_PressedOnClickRelease on OpenOnDoubleClick because we want the item to be active on the initial MouseDown in order for drag and drop to work.
    if (is_mouse_x_over_arrow && (flags & ImGuiTreeNodeFlags_OpenOnArrow))
        button_flags |= ImGuiButtonFlags_PressedOnClick;
    else if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick;
    else
        button_flags |= ImGuiButtonFlags_PressedOnClickRelease;

    bool selected = (flags & ImGuiTreeNodeFlags_Selected) != 0;
    const bool was_selected = selected;

    bool hovered, held;
    bool pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    bool toggled = false;
    if (!is_leaf)
    {
        if (pressed && g.DragDropHoldJustPressedId != id)
        {
            if ((flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick)) == 0 || (g.NavActivateId == id))
                toggled = true;
            if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
                toggled |= is_mouse_x_over_arrow && !g.NavDisableMouseHover; // Lightweight equivalent of IsMouseHoveringRect() since ButtonBehavior() already did the job
            if ((flags & ImGuiTreeNodeFlags_OpenOnDoubleClick) && g.IO.MouseDoubleClicked[0])
                toggled = true;
        }
        else if (pressed && g.DragDropHoldJustPressedId == id)
        {
            IM_ASSERT(button_flags & ImGuiButtonFlags_PressedOnDragDropHold);
            if (!is_open) // When using Drag and Drop "hold to open" we keep the node highlighted after opening, but never close it again.
                toggled = true;
        }

        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Left && is_open)
        {
            toggled = true;
            NavMoveRequestCancel();
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right && !is_open) // If there's something upcoming on the line we may want to give it the priority?
        {
            toggled = true;
            NavMoveRequestCancel();
        }

        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledOpen;
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, TreeNodeBehavior() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImGuiNavHighlightFlags nav_highlight_flags = ImGuiNavHighlightFlags_TypeThin;
    if (display_frame)
    {
        // Framed type
        const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, true, style.FrameRounding);
        RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, ImVec2(text_pos.x - text_offset_x * 0.60f, text_pos.y + g.FontSize * 0.5f), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, ImVec2(text_pos.x - text_offset_x + padding.x, text_pos.y), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 1.0f);
        else // Leaf without bullet, left-adjusted text
            text_pos.x -= text_offset_x;
        if (flags & ImGuiTreeNodeFlags_ClipLabelForTrailingButton)
            frame_bb.Max.x -= g.FontSize + style.FramePadding.x;
        if (g.LogEnabled)
        {
            // NB: '##' is normally used to hide text (as a library-wide feature), so we need to specify the text range to make sure the ## aren't stripped out here.
            const char log_prefix[] = "\n##";
            const char log_suffix[] = "##";
            LogRenderedText(&text_pos, log_prefix, log_prefix+3);
            RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
            LogRenderedText(&text_pos, log_suffix, log_suffix+2);
        }
        else
        {
            RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
        }
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || selected)
        {
            const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
            RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, false);
            RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        }
        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, ImVec2(text_pos.x - text_offset_x * 0.5f, text_pos.y + g.FontSize * 0.5f), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, ImVec2(text_pos.x - text_offset_x + padding.x, text_pos.y + g.FontSize * 0.15f), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 0.70f);
        if (g.LogEnabled)
            LogRenderedText(&text_pos, ">");
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushOverrideID(id);
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
    return is_open;
}